

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_elements_confidentialtxout.cpp
# Opt level: O3

void __thiscall
ConfidentialTxOut_DecodeRangeProofInfoErrorTest_Test::
~ConfidentialTxOut_DecodeRangeProofInfoErrorTest_Test
          (ConfidentialTxOut_DecodeRangeProofInfoErrorTest_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(ConfidentialTxOut, DecodeRangeProofInfoErrorTest) {  
  // empty range_proof
  {
    ByteData range_proof("");
    try {
      EXPECT_THROW(ConfidentialTxOut::DecodeRangeProofInfo(range_proof), CfdException);
    } catch (const CfdException &cfd_exception) {
      EXPECT_EQ(cfd_exception.GetErrorCode(), CfdError::kCfdIllegalArgumentError);
      EXPECT_STREQ(cfd_exception.what(), "Secp256k1 empty range proof Error.");
    }
  }
  
  // invalid range_proof
  {
    ByteData range_proof("0000");
    try {
      EXPECT_THROW(ConfidentialTxOut::DecodeRangeProofInfo(range_proof), CfdException);
    } catch (const CfdException &cfd_exception) {
      EXPECT_EQ(cfd_exception.GetErrorCode(), CfdError::kCfdIllegalArgumentError);
      EXPECT_STREQ(cfd_exception.what(), "Secp256k1 empty range proof Error.");
    }
  }
}